

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_write_to_gather(char *prefix,kvtree *data,int ranks)

{
  uint uVar1;
  int iVar2;
  char *__nptr;
  long lVar3;
  kvtree *pkVar4;
  kvtree *pkVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  kvtree_elem_struct *pkVar9;
  int iVar10;
  kvtree *entries;
  kvtree *files_hash;
  char tmp_4 [100];
  char tmp [100];
  char partname [1024];
  kvtree *local_8d8;
  int local_8d0;
  int local_8cc;
  kvtree *local_8c8;
  char *local_8c0;
  long local_8b8;
  kvtree *local_8b0;
  char local_8a8 [112];
  char local_838 [1024];
  char local_438 [1032];
  
  local_8c0 = prefix;
  __nptr = getenv("KVTREE_ENTRIES_PER_FILE");
  if (__nptr == (char *)0x0) {
    lVar3 = 0x2000;
  }
  else {
    lVar3 = atol(__nptr);
  }
  kvtree_sort_int(data,0);
  pkVar4 = (kvtree *)
           kvtree_malloc(8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x47);
  pkVar4->lh_first = (kvtree_elem_struct *)0x0;
  local_8b0 = pkVar4;
  sprintf(local_838,"%d",1);
  local_8c8 = pkVar4;
  kvtree_set_kv(pkVar4,"LEVEL",local_838);
  if (data == (kvtree *)0x0) {
    iVar10 = 0;
  }
  else {
    pkVar9 = data->lh_first;
    iVar10 = 0;
    if (pkVar9 != (kvtree_elem_struct *)0x0) {
      local_8b8 = lVar3;
      if (lVar3 < 1) {
        local_8b8 = 0;
      }
      local_8cc = 0;
      uVar7 = 0;
      do {
        pkVar4 = (kvtree *)
                 kvtree_malloc(8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                               ,0x47);
        pkVar4->lh_first = (kvtree_elem_struct *)0x0;
        local_8d8 = pkVar4;
        sprintf(local_838,"%d",0);
        kvtree_set_kv(pkVar4,"LEVEL",local_838);
        pkVar4 = local_8d8;
        sprintf(local_838,"%d",(ulong)(uint)ranks);
        kvtree_set_kv(pkVar4,"RANKS",local_838);
        lVar3 = 0;
        do {
          lVar8 = local_8b8;
          if (local_8b8 == lVar3) goto LAB_00105806;
          uVar1 = atoi(pkVar9->key);
          pkVar5 = local_8d8;
          pkVar4 = pkVar9->hash;
          sprintf(local_838,"%d",(ulong)uVar1);
          pkVar5 = kvtree_set_kv(pkVar5,"RANK",local_838);
          kvtree_merge(pkVar5,pkVar4);
          lVar3 = lVar3 + 1;
          pkVar9 = (pkVar9->pointers).le_next;
        } while (pkVar9 != (kvtree_elem_struct *)0x0);
        pkVar9 = (kvtree_elem_struct *)0x0;
        lVar8 = lVar3;
LAB_00105806:
        snprintf(local_838,0x400,"%s.0.%d",local_8c0,(ulong)uVar7);
        local_8d0 = kvtree_write_file(local_838,local_8d8);
        kvtree_delete(&local_8d8);
        snprintf(local_438,0x400,".0.%d",(ulong)uVar7);
        sprintf(local_8a8,"%d",(ulong)uVar7);
        pkVar4 = kvtree_set_kv(local_8c8,"RANK",local_8a8);
        kvtree_util_set_str(pkVar4,"FILE",local_438);
        kvtree_util_set_bytecount(pkVar4,"OFFSET",0);
        if (local_8d0 != 0) {
          iVar10 = 1;
          break;
        }
        uVar7 = uVar7 + (int)lVar8;
        iVar10 = local_8cc;
      } while (pkVar9 != (kvtree_elem_struct *)0x0);
    }
  }
  sprintf(local_838,"%d",(ulong)(uint)ranks);
  pkVar4 = local_8c8;
  kvtree_set_kv(local_8c8,"RANKS",local_838);
  iVar2 = kvtree_write_file(local_8c0,pkVar4);
  iVar6 = 1;
  if (iVar2 == 0) {
    iVar6 = iVar10;
  }
  kvtree_delete(&local_8b0);
  return iVar6;
}

Assistant:

int kvtree_write_to_gather(const char* prefix, kvtree* data, int ranks)
{
  int rc = KVTREE_SUCCESS;
  /* record up to 8K entries per file */
  long entries_per_file = 8192;

  /*
   * KVTREE_ENTRIES_PER_FILE is only used for testing.  Specifically, you can
   * set it to something low like 1 to force kvwrite_write_to_gather() to write
   * multiple kvtree files.
   */
  if (getenv("KVTREE_ENTRIES_PER_FILE")) {
    entries_per_file = atol(getenv("KVTREE_ENTRIES_PER_FILE"));
  }

  /* we hardcode this to be two levels deep */

  /* sort so that elements are ordered by rank value */
  kvtree_sort_int(data, KVTREE_SORT_ASCENDING);

  /* create hash for primary map and encode level */
  kvtree* files_hash = kvtree_new();
  kvtree_set_kv_int(files_hash, "LEVEL", 1);

  /* iterate over each rank to record its info */
  int writer = 0;
  int max_rank = -1;
  kvtree_elem* elem = kvtree_elem_first(data);
  while (elem != NULL) {
    /* create a hash to record an entry from each rank */
    kvtree* entries = kvtree_new();
    kvtree_set_kv_int(entries, "LEVEL", 0);

    /* record the total number of ranks in each file */
    kvtree_set_kv_int(entries, "RANKS", ranks);

    int count = 0;
    while (count < entries_per_file) {
      /* get rank id */
      int rank = kvtree_elem_key_int(elem);
      if (rank > max_rank) {
        max_rank = rank;
      }

      /* copy hash of current rank under RANK/<rank> in entries */
      kvtree* elem_hash = kvtree_elem_hash(elem);
      kvtree* rank_hash = kvtree_set_kv_int(entries, "RANK", rank);
      kvtree_merge(rank_hash, elem_hash);
      count++;

      /* break early if we reach the end */
      elem = kvtree_elem_next(elem);
      if (elem == NULL) {
        break;
      }
    }

    /* build name for part file */
    char filename[1024];
    snprintf(filename, sizeof(filename), "%s.0.%d", prefix, writer);

    /* write hash to file */
    if (kvtree_write_file(filename, entries) != KVTREE_SUCCESS) {
      rc = KVTREE_FAILURE;
      elem = NULL;
    }

    /* delete part hash and path */
    kvtree_delete(&entries);

    /* record file name of part in files hash, relative to prefix directory */
    char partname[1024];
    snprintf(partname, sizeof(partname), ".0.%d", writer);
    unsigned long offset = 0;
    kvtree* files_rank_hash = kvtree_set_kv_int(files_hash, "RANK", writer);
    kvtree_util_set_str(files_rank_hash, "FILE", partname);
    kvtree_util_set_bytecount(files_rank_hash, "OFFSET", offset);

    /* get id of next writer */
    writer += count;
  }

  /* record total number of ranks in job as max rank + 1 */
  kvtree_set_kv_int(files_hash, "RANKS", ranks);

  /* write out root file */
  if (kvtree_write_file(prefix, files_hash) != KVTREE_SUCCESS) {
    rc = KVTREE_FAILURE;
  }
  kvtree_delete(&files_hash);

  return rc;
}